

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::Cord::RemoveSuffix(Cord *this,size_t n)

{
  bool bVar1;
  size_t sVar2;
  Nullable<absl::cord_internal::CordRep_*> rep_00;
  Nullable<absl::cord_internal::CordzInfo_*> info;
  CordRepBtree *tree_00;
  CordRep *pCVar3;
  AlphaNum *in_R9;
  bool local_161;
  CordRep *rep;
  CordzUpdateScope scope;
  Nullable<CordRep_*> pCStack_138;
  MethodIdentifier method;
  CordRep *tree;
  char *local_128;
  char *absl_raw_log_internal_filename;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string death_message;
  size_t n_local;
  Cord *this_local;
  
  death_message.field_2._8_8_ = n;
  sVar2 = size(this);
  if (sVar2 < n) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_38,"Check n <= size() failed: ",&local_39);
    std::allocator<char>::~allocator(&local_39);
    AlphaNum::AlphaNum(&local_90,"Requested suffix size ");
    AlphaNum::AlphaNum(&local_c0,death_message.field_2._8_8_);
    AlphaNum::AlphaNum(&local_f0," exceeds Cord\'s size ");
    sVar2 = size(this);
    AlphaNum::AlphaNum((AlphaNum *)&absl_raw_log_internal_filename,sVar2);
    StrCat_abi_cxx11_(&local_60,(absl *)&local_90,&local_c0,&local_f0,
                      (AlphaNum *)&absl_raw_log_internal_filename,in_R9);
    std::__cxx11::string::operator+=((string *)local_38,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    local_128 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
    ;
    tree._4_4_ = 3;
    tree._0_4_ = 0x2c5;
    base_internal::
    AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)>::operator()
              ((AtomicHook<void(*)(absl::LogSeverity,char_const*,int,std::__cxx11::string_const&)> *
               )raw_log_internal::internal_log_function_abi_cxx11_,(LogSeverity *)((long)&tree + 4),
               &local_128,(int *)&tree,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2c5,"void absl::Cord::RemoveSuffix(size_t)");
  }
  InlineRep::MaybeRemoveEmptyCrcNode(&this->contents_);
  rep_00 = InlineRep::tree(&this->contents_);
  if (rep_00 == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    InlineRep::reduce_size(&this->contents_,death_message.field_2._8_8_);
  }
  else {
    scope.info_._4_4_ = 0x16;
    info = InlineRep::cordz_info(&this->contents_);
    cord_internal::CordzUpdateScope::CordzUpdateScope((CordzUpdateScope *)&rep,info,kRemoveSuffix);
    pCStack_138 = cord_internal::RemoveCrcNode(rep_00);
    if ((ulong)death_message.field_2._8_8_ < pCStack_138->length) {
      bVar1 = cord_internal::CordRep::IsBtree(pCStack_138);
      if (bVar1) {
        tree_00 = cord_internal::CordRep::btree(pCStack_138);
        pCStack_138 = cord_internal::CordRepBtree::RemoveSuffix(tree_00,death_message.field_2._8_8_)
        ;
      }
      else {
        bVar1 = cord_internal::CordRep::IsExternal(pCStack_138);
        if ((bVar1) ||
           (bVar1 = cord_internal::RefcountAndFlags::IsOne(&pCStack_138->refcount), !bVar1)) {
          pCVar3 = cord_internal::CordRepSubstring::Substring
                             (pCStack_138,0,pCStack_138->length - death_message.field_2._8_8_);
          cord_internal::CordRep::Unref(pCStack_138);
          pCStack_138 = pCVar3;
        }
        else {
          bVar1 = cord_internal::CordRep::IsFlat(pCStack_138);
          local_161 = true;
          if (!bVar1) {
            local_161 = cord_internal::CordRep::IsSubstring(pCStack_138);
          }
          if (local_161 == false) {
            __assert_fail("tree->IsFlat() || tree->IsSubstring()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
                          ,0x2d4,"void absl::Cord::RemoveSuffix(size_t)");
          }
          pCStack_138->length = pCStack_138->length - death_message.field_2._8_8_;
        }
      }
    }
    else {
      cord_internal::CordRep::Unref(pCStack_138);
      pCStack_138 = (Nullable<CordRep_*>)0x0;
    }
    InlineRep::SetTreeOrEmpty(&this->contents_,pCStack_138,(CordzUpdateScope *)&rep);
    cord_internal::CordzUpdateScope::~CordzUpdateScope((CordzUpdateScope *)&rep);
  }
  return;
}

Assistant:

void Cord::RemoveSuffix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested suffix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.reduce_size(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemoveSuffix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      tree = CordRepBtree::RemoveSuffix(tree->btree(), n);
    } else if (!tree->IsExternal() && tree->refcount.IsOne()) {
      assert(tree->IsFlat() || tree->IsSubstring());
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, 0, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}